

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::dtime_tz_t>
               (timestamp_t input,dtime_tz_t *result,bool strict)

{
  dtime_t dVar1;
  
  if ((input.value != -0x7fffffffffffffff) && (input.value != 0x7fffffffffffffff)) {
    dVar1 = Timestamp::GetTime(input);
    result->bits = dVar1.micros << 0x18 | 0xe0ff;
  }
  return input.value != -0x7fffffffffffffff && input.value != 0x7fffffffffffffff;
}

Assistant:

bool TryCast::Operation(timestamp_t input, dtime_tz_t &result, bool strict) {
	if (!Timestamp::IsFinite(input)) {
		return false;
	}
	result = dtime_tz_t(Timestamp::GetTime(input), 0);
	return true;
}